

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::RotationX<std::complex<double>_>::matrix(RotationX<std::complex<double>_> *this)

{
  double dVar1;
  complex<double> m10;
  complex<double> m11;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  data_type extraout_RDX_00;
  QRotationGate1<std::complex<double>_> *in_RSI;
  undefined8 in_R8;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  SquareMatrix<std::complex<double>_> SVar3;
  complex<double> m00;
  complex<double> m01;
  undefined8 in_stack_ffffffffffffff88;
  QRotationGate1<std::complex<double>_> *this_00;
  RotationX<std::complex<double>_> *pRVar4;
  complex<double> local_58;
  complex<double> local_48;
  complex<double> local_38;
  complex<double> local_28;
  RotationX<std::complex<double>_> *this_local;
  
  this_00 = in_RSI;
  pRVar4 = this;
  this_local = this;
  dVar1 = QRotationGate1<std::complex<double>_>::cos(in_RSI,(double)CONCAT44(in_XMM0_Db,in_XMM0_Da))
  ;
  std::complex<double>::complex(&local_28,dVar1,0.0);
  dVar1 = QRotationGate1<std::complex<double>_>::sin
                    (this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  std::complex<double>::complex(&local_38,0.0,-dVar1);
  dVar1 = QRotationGate1<std::complex<double>_>::sin
                    (this_00,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  uVar2 = 0x8000000000000000;
  std::complex<double>::complex(&local_48,0.0,-dVar1);
  dVar1 = QRotationGate1<std::complex<double>_>::cos
                    (this_00,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  std::complex<double>::complex(&local_58,dVar1,0.0);
  m10._M_value._8_8_ = this_00;
  m10._M_value._0_8_ = in_stack_ffffffffffffff88;
  m11._M_value._8_8_ = pRVar4;
  m11._M_value._0_8_ = this;
  m00._M_value._8_8_ = extraout_RDX;
  m00._M_value._0_8_ = in_RSI;
  m01._M_value._8_8_ = in_R8;
  m01._M_value._0_8_ = uVar2;
  dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)this,m00,m01,m10,m11);
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX_00._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)pRVar4;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using SqMat = qclab::dense::SquareMatrix< T > ;
          return SqMat(      this->cos()  , T(0,-this->sin()) ,
                        T(0,-this->sin()) ,      this->cos()  ) ;
        }